

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O3

void Image_Function::GetGaussianKernel
               (vector<float,_std::allocator<float>_> *filter,uint32_t width,uint32_t height,
               uint32_t kernelSize,float sigma)

{
  uint uVar1;
  pointer pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  byte bVar17;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  imageException *this;
  float *x;
  pointer pfVar21;
  int iVar22;
  long lVar23;
  pointer pfVar24;
  int32_t posX;
  int iVar25;
  ushort uVar26;
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  float fVar33;
  float fVar34;
  
  if ((((2 < width) && (2 < height)) && (kernelSize != 0)) &&
     (((uVar19 = kernelSize * 2, uVar19 < width && (uVar19 < height)) && (0.0 <= sigma)))) {
    uVar1 = kernelSize * 2 + 1;
    std::vector<float,_std::allocator<float>_>::resize(filter,(ulong)(height * width));
    pfVar21 = (filter->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pfVar2 = (filter->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pfVar21 != pfVar2) {
      memset(pfVar21,0,((long)pfVar2 + (-4 - (long)pfVar21) & 0xfffffffffffffffcU) + 4);
    }
    fVar34 = 0.0;
    pfVar21 = pfVar21 + (ulong)(((height >> 1) - kernelSize) * width) +
                        ((ulong)(width >> 1) - (ulong)kernelSize);
    pfVar2 = pfVar21 + uVar1 * width;
    pfVar24 = pfVar21;
    iVar22 = -kernelSize;
    do {
      lVar23 = 0;
      iVar25 = -kernelSize;
      do {
        fVar33 = expf(-(float)(iVar25 * iVar25 + iVar22 * iVar22) / (sigma + sigma));
        iVar25 = iVar25 + 1;
        fVar33 = (1.0 / ((sigma + sigma) * 3.1415927)) * fVar33;
        fVar34 = fVar34 + fVar33;
        *(float *)((long)pfVar24 + lVar23) = fVar33;
        lVar23 = lVar23 + 4;
      } while ((ulong)uVar19 * 4 + 4 != lVar23);
      pfVar24 = pfVar24 + width;
      iVar22 = iVar22 + 1;
    } while (pfVar24 != pfVar2);
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar29 = vpbroadcastq_avx512f();
    auVar30 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar34)));
    do {
      uVar20 = 0;
      do {
        auVar31 = vpbroadcastq_avx512f();
        auVar32 = vporq_avx512f(auVar31,auVar27);
        auVar31 = vporq_avx512f(auVar31,auVar28);
        uVar16 = vpcmpuq_avx512f(auVar31,auVar29,2);
        bVar17 = (byte)uVar16;
        uVar16 = vpcmpuq_avx512f(auVar32,auVar29,2);
        bVar18 = (byte)uVar16;
        uVar26 = CONCAT11(bVar18,bVar17);
        pfVar24 = pfVar21 + uVar20;
        auVar31._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * (int)pfVar24[1];
        auVar31._0_4_ = (uint)(bVar17 & 1) * (int)*pfVar24;
        auVar31._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * (int)pfVar24[2];
        auVar31._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * (int)pfVar24[3];
        auVar31._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * (int)pfVar24[4];
        auVar31._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * (int)pfVar24[5];
        auVar31._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * (int)pfVar24[6];
        auVar31._28_4_ = (uint)((byte)(uVar26 >> 7) & 1) * (int)pfVar24[7];
        auVar31._32_4_ = (uint)(bVar18 & 1) * (int)pfVar24[8];
        auVar31._36_4_ = (uint)(bVar18 >> 1 & 1) * (int)pfVar24[9];
        auVar31._40_4_ = (uint)(bVar18 >> 2 & 1) * (int)pfVar24[10];
        auVar31._44_4_ = (uint)(bVar18 >> 3 & 1) * (int)pfVar24[0xb];
        auVar31._48_4_ = (uint)(bVar18 >> 4 & 1) * (int)pfVar24[0xc];
        auVar31._52_4_ = (uint)(bVar18 >> 5 & 1) * (int)pfVar24[0xd];
        auVar31._56_4_ = (uint)(bVar18 >> 6 & 1) * (int)pfVar24[0xe];
        auVar31._60_4_ = (uint)(bVar18 >> 7) * (int)pfVar24[0xf];
        auVar31 = vmulps_avx512f(auVar30,auVar31);
        pfVar24 = pfVar21 + uVar20;
        bVar3 = (bool)((byte)(uVar26 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar26 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar26 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar26 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar26 >> 7) & 1);
        bVar10 = (bool)(bVar18 >> 1 & 1);
        bVar11 = (bool)(bVar18 >> 2 & 1);
        bVar12 = (bool)(bVar18 >> 3 & 1);
        bVar13 = (bool)(bVar18 >> 4 & 1);
        bVar14 = (bool)(bVar18 >> 5 & 1);
        bVar15 = (bool)(bVar18 >> 6 & 1);
        *pfVar24 = (float)((uint)(bVar17 & 1) * auVar31._0_4_ |
                          (uint)!(bool)(bVar17 & 1) * (int)*pfVar24);
        pfVar24[1] = (float)((uint)bVar3 * auVar31._4_4_ | (uint)!bVar3 * (int)pfVar24[1]);
        pfVar24[2] = (float)((uint)bVar4 * auVar31._8_4_ | (uint)!bVar4 * (int)pfVar24[2]);
        pfVar24[3] = (float)((uint)bVar5 * auVar31._12_4_ | (uint)!bVar5 * (int)pfVar24[3]);
        pfVar24[4] = (float)((uint)bVar6 * auVar31._16_4_ | (uint)!bVar6 * (int)pfVar24[4]);
        pfVar24[5] = (float)((uint)bVar7 * auVar31._20_4_ | (uint)!bVar7 * (int)pfVar24[5]);
        pfVar24[6] = (float)((uint)bVar8 * auVar31._24_4_ | (uint)!bVar8 * (int)pfVar24[6]);
        pfVar24[7] = (float)((uint)bVar9 * auVar31._28_4_ | (uint)!bVar9 * (int)pfVar24[7]);
        pfVar24[8] = (float)((uint)(bVar18 & 1) * auVar31._32_4_ |
                            (uint)!(bool)(bVar18 & 1) * (int)pfVar24[8]);
        pfVar24[9] = (float)((uint)bVar10 * auVar31._36_4_ | (uint)!bVar10 * (int)pfVar24[9]);
        pfVar24[10] = (float)((uint)bVar11 * auVar31._40_4_ | (uint)!bVar11 * (int)pfVar24[10]);
        pfVar24[0xb] = (float)((uint)bVar12 * auVar31._44_4_ | (uint)!bVar12 * (int)pfVar24[0xb]);
        pfVar24[0xc] = (float)((uint)bVar13 * auVar31._48_4_ | (uint)!bVar13 * (int)pfVar24[0xc]);
        pfVar24[0xd] = (float)((uint)bVar14 * auVar31._52_4_ | (uint)!bVar14 * (int)pfVar24[0xd]);
        pfVar24[0xe] = (float)((uint)bVar15 * auVar31._56_4_ | (uint)!bVar15 * (int)pfVar24[0xe]);
        pfVar24[0xf] = (float)((uint)(bVar18 >> 7) * auVar31._60_4_ |
                              (uint)!(bool)(bVar18 >> 7) * (int)pfVar24[0xf]);
        uVar20 = uVar20 + 0x10;
      } while (((ulong)uVar1 + 0xf & 0xfffffffffffffff0) != uVar20);
      pfVar21 = pfVar21 + width;
    } while (pfVar21 != pfVar2);
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Incorrect input parameters for Gaussian filter kernel");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void GetGaussianKernel( std::vector<float> & filter, uint32_t width, uint32_t height, uint32_t kernelSize, float sigma )
    {
        if( width < 3 || height < 3 || kernelSize == 0 || width < (kernelSize * 2 + 1) || height < (kernelSize * 2 + 1) || sigma < 0 )
            throw imageException( "Incorrect input parameters for Gaussian filter kernel" );

        filter.resize( width * height );

        std::fill( filter.begin(), filter.end(), 0.0f );

        static const float pi = 3.1415926536f;
        const float doubleSigma = sigma * 2;
        const float doubleSigmaPiInv = 1.0f / (doubleSigma * pi);
        const uint32_t twiceKernelSizePlusOne = 2 * kernelSize + 1;

        float * y = filter.data() + (height / 2 - kernelSize) * width + width / 2 - kernelSize;
        const float * endY = y + twiceKernelSizePlusOne * width;

        float sum = 0;

        for( int32_t posY = -static_cast<int32_t>(kernelSize) ; y != endY; y += width, ++posY ) {
            float * x = y;
            const float * endX = x + twiceKernelSizePlusOne;
            const int32_t posY2 = posY * posY;

            for( int32_t posX = -static_cast<int32_t>(kernelSize) ; x != endX; ++x, ++posX ) {
                *x = doubleSigmaPiInv * expf( -static_cast<float>(posX * posX + posY2) / doubleSigma );
                sum += *x;
            }
        }

        const float normalization = 1.0f / sum;

        y = filter.data() + (height / 2 - kernelSize) * width + width / 2 - kernelSize;

        for( int32_t posY = -static_cast<int32_t>(kernelSize) ; y != endY; y += width, ++posY ) {
            float * x = y;
            const float * endX = x + twiceKernelSizePlusOne;

            for( int32_t posX = -static_cast<int32_t>(kernelSize) ; x != endX; ++x, ++posX ) {
                *x *= normalization;
            }
        }
    }